

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pagerOpenWalIfPresent(Pager *pPager)

{
  Pgno local_24;
  int local_20;
  Pgno nPage;
  int isWal;
  int rc;
  Pager *pPager_local;
  
  nPage = 0;
  if ((pPager->tempFile == '\0') &&
     (_isWal = pPager, nPage = sqlite3OsAccess(pPager->pVfs,pPager->zWal,0,&local_20), nPage == 0))
  {
    if (local_20 == 0) {
      if (_isWal->journalMode == '\x05') {
        _isWal->journalMode = '\0';
      }
    }
    else {
      nPage = pagerPagecount(_isWal,&local_24);
      if (nPage != 0) {
        return nPage;
      }
      if (local_24 == 0) {
        nPage = sqlite3OsDelete(_isWal->pVfs,_isWal->zWal,0);
      }
      else {
        nPage = sqlite3PagerOpenWal(_isWal,(int *)0x0);
      }
    }
  }
  return nPage;
}

Assistant:

static int pagerOpenWalIfPresent(Pager *pPager){
  int rc = SQLITE_OK;
  assert( pPager->eState==PAGER_OPEN );
  assert( pPager->eLock>=SHARED_LOCK );

  if( !pPager->tempFile ){
    int isWal;                    /* True if WAL file exists */
    rc = sqlite3OsAccess(
        pPager->pVfs, pPager->zWal, SQLITE_ACCESS_EXISTS, &isWal
    );
    if( rc==SQLITE_OK ){
      if( isWal ){
        Pgno nPage;                   /* Size of the database file */

        rc = pagerPagecount(pPager, &nPage);
        if( rc ) return rc;
        if( nPage==0 ){
          rc = sqlite3OsDelete(pPager->pVfs, pPager->zWal, 0);
        }else{
          testcase( sqlite3PcachePagecount(pPager->pPCache)==0 );
          rc = sqlite3PagerOpenWal(pPager, 0);
        }
      }else if( pPager->journalMode==PAGER_JOURNALMODE_WAL ){
        pPager->journalMode = PAGER_JOURNALMODE_DELETE;
      }
    }
  }
  return rc;
}